

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPServer.hpp
# Opt level: O1

Method __thiscall webfront::http::Request::getMethodFromString(Request *this,string_view text)

{
  char *__s;
  int iVar1;
  Request *pRVar2;
  size_t index;
  long lVar3;
  array<const_char_*,_9UL> *paVar4;
  size_type __rlen;
  
  paVar4 = &methodNames;
  lVar3 = 0;
  do {
    __s = paVar4->_M_elems[0];
    pRVar2 = (Request *)strlen(__s);
    if (pRVar2 == this) {
      if (this == (Request *)0x0) goto LAB_001128a2;
      iVar1 = bcmp((void *)text._M_len,__s,(size_t)this);
      if (iVar1 == 0) goto LAB_001128a2;
    }
    lVar3 = lVar3 + 1;
    paVar4 = (array<const_char_*,_9UL> *)((long)paVar4 + 8);
  } while (lVar3 != 9);
  lVar3 = 9;
LAB_001128a2:
  return (Method)lVar3;
}

Assistant:

[[nodiscard]] static Method getMethodFromString(std::string_view text) {
        for (size_t index = 0; index < methodNames.size(); ++index)
            if (methodNames[index] == text) return static_cast<Method>(index);
        return Method::Undefined;
    }